

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DXFLoader.cpp
# Opt level: O3

void __thiscall
Assimp::DXFImporter::ConvertMeshes(DXFImporter *this,aiScene *pScene,FileData *output)

{
  vector<Assimp::DXF::PolyLine_const*,std::allocator<Assimp::DXF::PolyLine_const*>> *this_00;
  pointer paVar1;
  pointer pBVar2;
  pointer psVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  mapped_type pBVar5;
  PolyLine *pPVar6;
  iterator __position;
  _Base_ptr __n;
  pointer ppPVar7;
  pointer puVar8;
  pointer paVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  pointer pvVar13;
  bool bVar14;
  int iVar15;
  mapped_type_conflict2 mVar16;
  pointer pBVar17;
  Logger *this_01;
  mapped_type *ppBVar18;
  iterator iVar19;
  mapped_type_conflict2 *pmVar20;
  _Rb_tree_node_base *__s;
  aiMesh *paVar21;
  pointer ppPVar22;
  aiVector3D *__s_00;
  aiColor4D *__s_01;
  ulong *puVar23;
  aiFace *paVar24;
  uint *puVar25;
  uint *puVar26;
  long lVar27;
  runtime_error *prVar28;
  uint uVar29;
  FileData *extraout_RDX;
  ulong uVar30;
  FileData *pFVar31;
  FileData *extraout_RDX_00;
  ulong uVar32;
  aiFace *paVar33;
  ulong uVar34;
  string *this_02;
  string *__k;
  _Rb_tree_node_base *this_03;
  pointer puVar35;
  ulong uVar36;
  _Base_ptr p_Var37;
  aiVector3D *paVar38;
  Block *bl;
  mapped_type pBVar39;
  pointer psVar40;
  uint uVar41;
  Block *bl_00;
  pointer puVar42;
  uint uVar43;
  undefined1 auVar44 [16];
  vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_> pv;
  LayerMap layers;
  vector<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>,_std::allocator<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>_>_>
  corr;
  BlockMap blocks_by_name;
  PolyLine *local_248;
  undefined8 uStack_240;
  undefined8 local_238 [2];
  aiMesh *local_228;
  _Rb_tree_node_base *local_220;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  local_218;
  vector<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>,_std::allocator<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>_>_>
  local_1e8;
  pointer local_1c8;
  pointer local_1c0;
  uint *local_1b8;
  PolyLine *local_1b0;
  undefined1 local_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  _Base_ptr local_188;
  size_t local_180;
  ios_base local_138 [264];
  
  bVar14 = DefaultLogger::isNullLogger();
  if (!bVar14) {
    pBVar2 = (output->blocks).
             super__Vector_base<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pBVar17 = (output->blocks).
                   super__Vector_base<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>.
                   _M_impl.super__Vector_impl_data._M_start; pBVar17 != pBVar2;
        pBVar17 = pBVar17 + 1) {
      psVar3 = (pBVar17->lines).
               super__Vector_base<std::shared_ptr<Assimp::DXF::PolyLine>,_std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (psVar40 = (pBVar17->lines).
                     super__Vector_base<std::shared_ptr<Assimp::DXF::PolyLine>,_std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; psVar40 != psVar3;
          psVar40 = psVar40 + 1) {
        p_Var4 = (psVar40->super___shared_ptr<Assimp::DXF::PolyLine,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount._M_pi;
        if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
          }
        }
        if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
        }
      }
    }
    this_01 = DefaultLogger::get();
    Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
    basic_formatter<char[30]>
              ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
               (char (*) [30])"DXF: Unexpanded polycount is ");
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,", vertex count is ",0x12);
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__cxx11::stringbuf::str();
    Logger::debug(this_01,(char *)local_218._M_impl._0_8_);
    if ((_Base_ptr *)local_218._M_impl._0_8_ !=
        &local_218._M_impl.super__Rb_tree_header._M_header._M_parent) {
      operator_delete((void *)local_218._M_impl._0_8_);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  pBVar39 = (output->blocks).
            super__Vector_base<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>._M_impl.
            super__Vector_impl_data._M_start;
  pBVar5 = (output->blocks).
           super__Vector_base<Assimp::DXF::Block,_std::allocator<Assimp::DXF::Block>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pBVar5 == pBVar39) {
    prVar28 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_1a8._0_8_ = &local_198;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"DXF: no data blocks loaded","");
    std::runtime_error::runtime_error(prVar28,(string *)local_1a8);
    *(undefined ***)prVar28 = &PTR__runtime_error_00875f28;
    __cxa_throw(prVar28,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  local_198._8_8_ = local_1a8 + 8;
  local_1a8._8_4_ = _S_red;
  bl_00 = (Block *)0x0;
  local_198._M_allocated_capacity = 0;
  local_180 = 0;
  local_188 = (_Base_ptr)local_198._8_8_;
  do {
    __k = &pBVar39->name;
    this_02 = (string *)local_1a8;
    ppBVar18 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::DXF::Block_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::DXF::Block_*>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::DXF::Block_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::DXF::Block_*>_>_>
                             *)local_1a8,__k);
    *ppBVar18 = pBVar39;
    if (bl_00 == (Block *)0x0) {
      iVar15 = std::__cxx11::string::compare((char *)__k);
      this_02 = __k;
      bl_00 = (Block *)0x0;
      if (iVar15 == 0) {
        bl_00 = pBVar39;
      }
    }
    pBVar39 = pBVar39 + 1;
  } while (pBVar39 != pBVar5);
  if (bl_00 == (Block *)0x0) {
    prVar28 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_218._M_impl._0_8_ = &local_218._M_impl.super__Rb_tree_header._M_header._M_parent;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_218,"DXF: no ENTITIES data block loaded","");
    std::runtime_error::runtime_error(prVar28,(string *)&local_218);
    *(undefined ***)prVar28 = &PTR__runtime_error_00875f28;
    __cxa_throw(prVar28,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  local_218._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_218._M_impl.super__Rb_tree_header._M_header;
  local_218._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_218._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_218._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1e8.
  super__Vector_base<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>,_std::allocator<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1e8.
  super__Vector_base<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>,_std::allocator<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8.
  super__Vector_base<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>,_std::allocator<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_218._M_impl.super__Rb_tree_header._M_header._M_right =
       local_218._M_impl.super__Rb_tree_header._M_header._M_left;
  ExpandBlockReferences((DXFImporter *)this_02,bl_00,(BlockMap *)local_1a8);
  psVar40 = (bl_00->lines).
            super__Vector_base<std::shared_ptr<Assimp::DXF::PolyLine>,_std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar3 = (bl_00->lines).
           super__Vector_base<std::shared_ptr<Assimp::DXF::PolyLine>,_std::allocator<std::shared_ptr<Assimp::DXF::PolyLine>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar40 != psVar3) {
    mVar16 = 0;
    do {
      pPVar6 = (psVar40->super___shared_ptr<Assimp::DXF::PolyLine,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      p_Var4 = (psVar40->super___shared_ptr<Assimp::DXF::PolyLine,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
      if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
        }
      }
      if ((pPVar6->positions).
          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          (pPVar6->positions).
          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
          super__Vector_impl_data._M_start) {
        iVar19 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                 ::find(&local_218,&pPVar6->layer);
        if ((_Rb_tree_header *)iVar19._M_node == &local_218._M_impl.super__Rb_tree_header) {
          pScene->mNumMeshes = pScene->mNumMeshes + 1;
          pmVar20 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                  *)&local_218,&pPVar6->layer);
          *pmVar20 = mVar16;
          local_248 = (PolyLine *)0x0;
          uStack_240 = 0;
          local_238[0] = 0;
          local_1b0 = pPVar6;
          std::vector<Assimp::DXF::PolyLine_const*,std::allocator<Assimp::DXF::PolyLine_const*>>::
          _M_realloc_insert<Assimp::DXF::PolyLine_const*>
                    ((vector<Assimp::DXF::PolyLine_const*,std::allocator<Assimp::DXF::PolyLine_const*>>
                      *)&local_248,(iterator)0x0,&local_1b0);
          std::
          vector<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>,_std::allocator<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>_>_>
          ::push_back(&local_1e8,(value_type *)&local_248);
          if (local_248 != (PolyLine *)0x0) {
            operator_delete(local_248);
          }
          mVar16 = mVar16 + 1;
        }
        else {
          this_00 = (vector<Assimp::DXF::PolyLine_const*,std::allocator<Assimp::DXF::PolyLine_const*>>
                     *)(local_1e8.
                        super__Vector_base<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>,_std::allocator<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + iVar19._M_node[2]._M_color);
          __position._M_current = *(PolyLine ***)(this_00 + 8);
          local_248 = pPVar6;
          if (__position._M_current == *(PolyLine ***)(this_00 + 0x10)) {
            std::vector<Assimp::DXF::PolyLine_const*,std::allocator<Assimp::DXF::PolyLine_const*>>::
            _M_realloc_insert<Assimp::DXF::PolyLine_const*>(this_00,__position,&local_248);
          }
          else {
            *__position._M_current = pPVar6;
            *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
          }
        }
      }
      if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
      }
      psVar40 = psVar40 + 1;
    } while (psVar40 != psVar3);
  }
  if ((ulong)pScene->mNumMeshes != 0) {
    uVar32 = (ulong)pScene->mNumMeshes << 3;
    __s = (_Rb_tree_node_base *)operator_new__(uVar32);
    this_03 = __s;
    memset(__s,0,uVar32);
    pScene->mMeshes = (aiMesh **)__s;
    pFVar31 = extraout_RDX;
    p_Var37 = local_218._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((_Rb_tree_header *)local_218._M_impl.super__Rb_tree_header._M_header._M_left !=
        &local_218._M_impl.super__Rb_tree_header) {
      do {
        paVar21 = (aiMesh *)operator_new(0x520);
        paVar21->mPrimitiveTypes = 0;
        paVar21->mNumVertices = 0;
        paVar21->mNumFaces = 0;
        memset(&paVar21->mVertices,0,0xcc);
        paVar21->mBones = (aiBone **)0x0;
        paVar21->mMaterialIndex = 0;
        (paVar21->mName).length = 0;
        (paVar21->mName).data[0] = '\0';
        memset((paVar21->mName).data + 1,0x1b,0x3ff);
        paVar21->mNumAnimMeshes = 0;
        paVar21->mAnimMeshes = (aiAnimMesh **)0x0;
        paVar21->mMethod = 0;
        (paVar21->mAABB).mMin.x = 0.0;
        (paVar21->mAABB).mMin.y = 0.0;
        (paVar21->mAABB).mMin.z = 0.0;
        (paVar21->mAABB).mMax.x = 0.0;
        (paVar21->mAABB).mMax.y = 0.0;
        (paVar21->mAABB).mMax.z = 0.0;
        memset(paVar21->mColors,0,0xa0);
        pScene->mMeshes[p_Var37[2]._M_color] = paVar21;
        __n = p_Var37[1]._M_parent;
        if (__n < (_Base_ptr)0x400) {
          (paVar21->mName).length = (ai_uint32)__n;
          memcpy((paVar21->mName).data,*(void **)(p_Var37 + 1),(size_t)__n);
          (paVar21->mName).data[(long)__n] = '\0';
        }
        pvVar13 = local_1e8.
                  super__Vector_base<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>,_std::allocator<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppPVar22 = local_1e8.
                   super__Vector_base<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>,_std::allocator<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[p_Var37[2]._M_color].
                   super__Vector_base<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppPVar7 = local_1e8.
                  super__Vector_base<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>,_std::allocator<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[p_Var37[2]._M_color].
                  super__Vector_base<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (ppPVar22 == ppPVar7) {
          uVar43 = 0;
          uVar32 = 0;
        }
        else {
          uVar32 = 0;
          uVar43 = 0;
          do {
            puVar42 = ((*ppPVar22)->counts).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            puVar8 = ((*ppPVar22)->counts).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            iVar15 = 0;
            if (puVar42 != puVar8) {
              iVar15 = 0;
              puVar35 = puVar42;
              do {
                iVar15 = iVar15 + *puVar35;
                puVar35 = puVar35 + 1;
              } while (puVar35 != puVar8);
            }
            uVar32 = (ulong)(uint)((int)uVar32 + iVar15);
            uVar43 = uVar43 + (int)((ulong)((long)puVar8 - (long)puVar42) >> 2);
            ppPVar22 = ppPVar22 + 1;
          } while (ppPVar22 != ppPVar7);
        }
        uVar41 = (uint)uVar32;
        local_228 = paVar21;
        local_220 = p_Var37;
        __s_00 = (aiVector3D *)operator_new__(uVar32 * 0xc);
        if (uVar41 != 0) {
          memset(__s_00,0,((uVar32 * 0xc - 0xc) / 0xc) * 0xc + 0xc);
        }
        paVar21->mVertices = __s_00;
        __s_01 = (aiColor4D *)operator_new__(uVar32 << 4);
        if (uVar41 != 0) {
          memset(__s_01,0,uVar32 << 4);
        }
        paVar21->mColors[0] = __s_01;
        uVar32 = (ulong)uVar43;
        puVar23 = (ulong *)operator_new__(uVar32 * 0x10 + 8);
        *puVar23 = uVar32;
        paVar33 = (aiFace *)(puVar23 + 1);
        if (uVar43 != 0) {
          paVar24 = paVar33;
          do {
            paVar24->mNumIndices = 0;
            paVar24->mIndices = (uint *)0x0;
            paVar24 = paVar24 + 1;
          } while (paVar24 != paVar33 + uVar32);
        }
        local_228->mFaces = paVar33;
        local_228->mNumVertices = uVar41;
        local_228->mNumFaces = uVar43;
        ppPVar22 = pvVar13[local_220[2]._M_color].
                   super__Vector_base<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        local_1c8 = pvVar13[local_220[2]._M_color].
                    super__Vector_base<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        if (ppPVar22 == local_1c8) {
          uVar43 = 0;
        }
        else {
          iVar15 = 0;
          uVar43 = 0;
          do {
            pPVar6 = *ppPVar22;
            puVar25 = (pPVar6->counts).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            local_1b8 = (pPVar6->counts).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_finish;
            local_1c0 = ppPVar22;
            if (puVar25 != local_1b8) {
              puVar42 = (pPVar6->indices).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              do {
                uVar32 = (ulong)*puVar25;
                paVar33->mNumIndices = *puVar25;
                puVar26 = (uint *)operator_new__(uVar32 * 4);
                paVar33->mIndices = puVar26;
                if (uVar32 != 0) {
                  lVar27 = 0;
                  uVar30 = 0;
                  paVar38 = __s_00;
                  do {
                    paVar33->mIndices[uVar30] = iVar15 + (int)uVar30;
                    paVar9 = (pPVar6->positions).
                             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                    uVar34 = ((long)(pPVar6->positions).
                                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)paVar9 >> 2)
                             * -0x5555555555555555;
                    if (uVar34 - ((long)(pPVar6->colors).
                                        super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(pPVar6->colors).
                                        super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 4) != 0) {
                      __assert_fail("pl->positions.size() == pl->colors.size()",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/DXF/DXFLoader.cpp"
                                    ,0x14c,
                                    "void Assimp::DXFImporter::ConvertMeshes(aiScene *, DXF::FileData &)"
                                   );
                    }
                    uVar36 = (ulong)puVar42[uVar30];
                    if (uVar34 < uVar36 || uVar34 - uVar36 == 0) {
                      prVar28 = (runtime_error *)__cxa_allocate_exception(0x10);
                      local_248 = (PolyLine *)local_238;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_248,"DXF: vertex index out of bounds","");
                      std::runtime_error::runtime_error(prVar28,(string *)&local_248);
                      *(undefined ***)prVar28 = &PTR__runtime_error_00875f28;
                      __cxa_throw(prVar28,&DeadlyImportError::typeinfo,
                                  std::runtime_error::~runtime_error);
                    }
                    __s_00 = paVar38 + 1;
                    paVar38->z = paVar9[uVar36].z;
                    fVar10 = paVar9[uVar36].y;
                    paVar38->x = paVar9[uVar36].x;
                    paVar38->y = fVar10;
                    paVar1 = (pPVar6->colors).
                             super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + puVar42[uVar30];
                    fVar10 = paVar1->g;
                    fVar11 = paVar1->b;
                    fVar12 = paVar1->a;
                    __s_01->r = paVar1->r;
                    __s_01->g = fVar10;
                    __s_01->b = fVar11;
                    __s_01->a = fVar12;
                    __s_01 = __s_01 + 1;
                    uVar30 = uVar30 + 1;
                    lVar27 = lVar27 + -4;
                    paVar38 = __s_00;
                  } while (uVar32 != uVar30);
                  iVar15 = iVar15 + (int)uVar30;
                  puVar42 = (pointer)((long)puVar42 - lVar27);
                }
                uVar29 = paVar33->mNumIndices - 1;
                uVar41 = 8;
                if (uVar29 < 3) {
                  uVar41 = *(uint *)(&DAT_0070d194 + (ulong)uVar29 * 4);
                }
                uVar43 = uVar43 | uVar41;
                paVar33 = paVar33 + 1;
                puVar25 = puVar25 + 1;
              } while (puVar25 != local_1b8);
            }
            ppPVar22 = local_1c0 + 1;
          } while (ppPVar22 != local_1c8);
        }
        local_228->mPrimitiveTypes = uVar43;
        local_228->mMaterialIndex = 0;
        this_03 = local_220;
        auVar44 = std::_Rb_tree_increment(local_220);
        pFVar31 = auVar44._8_8_;
        p_Var37 = auVar44._0_8_;
      } while ((_Rb_tree_header *)p_Var37 != &local_218._M_impl.super__Rb_tree_header);
    }
    GenerateHierarchy((DXFImporter *)this_03,pScene,pFVar31);
    GenerateMaterials((DXFImporter *)this_03,pScene,extraout_RDX_00);
    std::
    vector<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>,_std::allocator<std::vector<const_Assimp::DXF::PolyLine_*,_std::allocator<const_Assimp::DXF::PolyLine_*>_>_>_>
    ::~vector(&local_1e8);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
    ::~_Rb_tree(&local_218);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::DXF::Block_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::DXF::Block_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::DXF::Block_*>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::DXF::Block_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::DXF::Block_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Assimp::DXF::Block_*>_>_>
                 *)local_1a8);
    return;
  }
  prVar28 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_248 = (PolyLine *)local_238;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_248,"DXF: this file contains no 3d data","");
  std::runtime_error::runtime_error(prVar28,(string *)&local_248);
  *(undefined ***)prVar28 = &PTR__runtime_error_00875f28;
  __cxa_throw(prVar28,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void DXFImporter::ConvertMeshes(aiScene* pScene, DXF::FileData& output) {
    // the process of resolving all the INSERT statements can grow the
    // poly-count excessively, so log the original number.
    // XXX Option to import blocks as separate nodes?
    if (!DefaultLogger::isNullLogger()) {
        unsigned int vcount = 0, icount = 0;
        for (const DXF::Block& bl : output.blocks) {
            for (std::shared_ptr<const DXF::PolyLine> pl : bl.lines) {
                vcount += static_cast<unsigned int>(pl->positions.size());
                icount += static_cast<unsigned int>(pl->counts.size());
            }
        }

        ASSIMP_LOG_DEBUG_F("DXF: Unexpanded polycount is ", icount, ", vertex count is ", vcount);
    }

    if (! output.blocks.size()  ) {
        throw DeadlyImportError("DXF: no data blocks loaded");
    }

    DXF::Block* entities( nullptr );

    // index blocks by name
    DXF::BlockMap blocks_by_name;
    for (DXF::Block& bl : output.blocks) {
        blocks_by_name[bl.name] = &bl;
        if ( !entities && bl.name == AI_DXF_ENTITIES_MAGIC_BLOCK ) {
            entities = &bl;
        }
    }

    if (!entities) {
        throw DeadlyImportError("DXF: no ENTITIES data block loaded");
    }

    typedef std::map<std::string, unsigned int> LayerMap;

    LayerMap layers;
    std::vector< std::vector< const DXF::PolyLine*> > corr;

    // now expand all block references in the primary ENTITIES block
    // XXX this involves heavy memory copying, consider a faster solution for future versions.
    ExpandBlockReferences(*entities,blocks_by_name);

    unsigned int cur = 0;
    for (std::shared_ptr<const DXF::PolyLine> pl : entities->lines) {
        if (pl->positions.size()) {

            std::map<std::string, unsigned int>::iterator it = layers.find(pl->layer);
            if (it == layers.end()) {
                ++pScene->mNumMeshes;

                layers[pl->layer] = cur++;

                std::vector< const DXF::PolyLine* > pv;
                pv.push_back(&*pl);

                corr.push_back(pv);
            }
            else {
                corr[(*it).second].push_back(&*pl);
            }
        }
    }

    if ( 0 == pScene->mNumMeshes) {
        throw DeadlyImportError("DXF: this file contains no 3d data");
    }

    pScene->mMeshes = new aiMesh*[ pScene->mNumMeshes ] ();

    for(const LayerMap::value_type& elem : layers){
        aiMesh* const mesh =  pScene->mMeshes[elem.second] = new aiMesh();
        mesh->mName.Set(elem.first);

        unsigned int cvert = 0,cface = 0;
        for(const DXF::PolyLine* pl : corr[elem.second]){
            // sum over all faces since we need to 'verbosify' them.
            cvert += std::accumulate(pl->counts.begin(),pl->counts.end(),0);
            cface += static_cast<unsigned int>(pl->counts.size());
        }

        aiVector3D* verts = mesh->mVertices = new aiVector3D[cvert];
        aiColor4D* colors = mesh->mColors[0] = new aiColor4D[cvert];
        aiFace* faces = mesh->mFaces = new aiFace[cface];

        mesh->mNumVertices = cvert;
        mesh->mNumFaces = cface;

        unsigned int prims = 0;
        unsigned int overall_indices = 0;
        for(const DXF::PolyLine* pl : corr[elem.second]){

            std::vector<unsigned int>::const_iterator it = pl->indices.begin();
            for(unsigned int facenumv : pl->counts) {
                aiFace& face = *faces++;
                face.mIndices = new unsigned int[face.mNumIndices = facenumv];

                for (unsigned int i = 0; i < facenumv; ++i) {
                    face.mIndices[i] = overall_indices++;

                    ai_assert(pl->positions.size() == pl->colors.size());
                    if (*it >= pl->positions.size()) {
                        throw DeadlyImportError("DXF: vertex index out of bounds");
                    }

                    *verts++ = pl->positions[*it];
                    *colors++ = pl->colors[*it++];
                }

                // set primitive flags now, this saves the extra pass in ScenePreprocessor.
                switch(face.mNumIndices) {
                    case 1:
                        prims |= aiPrimitiveType_POINT;
                        break;
                    case 2:
                        prims |= aiPrimitiveType_LINE;
                        break;
                    case 3:
                        prims |= aiPrimitiveType_TRIANGLE;
                        break;
                    default:
                        prims |= aiPrimitiveType_POLYGON;
                        break;
                }
            }
        }

        mesh->mPrimitiveTypes = prims;
        mesh->mMaterialIndex = 0;
    }

    GenerateHierarchy(pScene,output);
    GenerateMaterials(pScene,output);
}